

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer *ppptVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  type_info **pptVar5;
  iterator __position;
  type_info *ptVar6;
  tuple_iterator tVar7;
  internals *piVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  __hash_code __code;
  type_info **pptVar11;
  bool bVar12;
  ulong uVar13;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  ulong uVar14;
  __node_base_ptr p_Var15;
  _Hash_node_base *p_Var16;
  sequence_fast_readonly sVar17;
  ulong uVar18;
  _typeobject *local_60;
  void *pvStack_58;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  handle local_38;
  type_info *tinfo;
  
  pvStack_58 = (void *)0x0;
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_ptr = t->tp_bases;
  if ((type_info *)local_38.m_ptr != (type_info *)0x0) {
    ((type_info *)local_38.m_ptr)->type =
         (PyTypeObject *)
         ((long)&(((type_info *)local_38.m_ptr)->type->ob_base).ob_base.ob_refcnt + 1);
  }
  sVar17.ptr = (PyObject **)&((type_info *)local_38.m_ptr)->type_align;
  if (((byte)((type_info *)local_38.m_ptr)->cpptype[0xab] & 2) != 0) {
    sVar17.ptr = (PyObject **)*sVar17.ptr;
  }
  tVar7 = tuple::end((tuple *)&local_38);
  if ((sequence_fast_readonly)sVar17.ptr != tVar7.super_sequence_fast_readonly.ptr) {
    do {
      local_60 = (_typeobject *)*sVar17.ptr;
      if (check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<_typeobject*,std::allocator<_typeobject*>>::_M_realloc_insert<_typeobject*>
                  ((vector<_typeobject*,std::allocator<_typeobject*>> *)&pvStack_58,
                   (iterator)
                   check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_60);
      }
      else {
        *check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
         super__Vector_impl_data._M_start = local_60;
        check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      sVar17.ptr = sVar17.ptr + 1;
    } while ((sequence_fast_readonly)sVar17.ptr != tVar7.super_sequence_fast_readonly.ptr);
  }
  object::~object((object *)&local_38);
  piVar8 = get_internals();
  if ((long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pvStack_58 != 0) {
    uVar14 = (long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)pvStack_58 >> 3;
    uVar18 = 0;
    do {
      p_Var16 = *(_Hash_node_base **)((long)pvStack_58 + uVar18 * 8);
      if (((ulong)p_Var16[1]._M_nxt[0x15]._M_nxt & 0x80000000) != 0) {
        uVar2 = (piVar8->registered_types_py)._M_h._M_bucket_count;
        uVar13 = (ulong)p_Var16 % uVar2;
        p_Var3 = (piVar8->registered_types_py)._M_h._M_buckets[uVar13];
        p_Var9 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var9 = p_Var3, p_Var15 = p_Var3->_M_nxt, p_Var16 != p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var10 = p_Var15->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
            p_Var9 = (__node_base_ptr)0x0;
            if (((ulong)p_Var10[1]._M_nxt % uVar2 != uVar13) ||
               (p_Var9 = p_Var15, p_Var15 = p_Var10, p_Var16 == p_Var10[1]._M_nxt))
            goto LAB_0010aa47;
          }
          p_Var9 = (__node_base_ptr)0x0;
        }
LAB_0010aa47:
        if (p_Var9 == (__node_base_ptr)0x0) {
          p_Var10 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var10 = p_Var9->_M_nxt;
        }
        if (p_Var10 == (_Hash_node_base *)0x0) {
          ptVar6 = (type_info *)p_Var16[0x2a]._M_nxt;
          if (ptVar6 != (type_info *)0x0) {
            if (uVar18 + 1 == uVar14) {
              check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
              super__Vector_impl_data._M_start =
                   check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                   super__Vector_impl_data._M_start + -1;
              uVar18 = uVar18 - 1;
            }
            ptVar6->type = (PyTypeObject *)((long)&(ptVar6->type->ob_base).ob_base.ob_refcnt + 1);
            sVar17.ptr = (PyObject **)&ptVar6->type_align;
            if (((byte)ptVar6->cpptype[0xab] & 2) != 0) {
              sVar17.ptr = (PyObject **)*sVar17.ptr;
            }
            local_38.m_ptr = (PyObject *)ptVar6;
            tVar7 = tuple::end((tuple *)&local_38);
            for (; (sequence_fast_readonly)sVar17.ptr != tVar7.super_sequence_fast_readonly.ptr;
                sVar17.ptr = sVar17.ptr + 1) {
              local_60 = (_typeobject *)*sVar17.ptr;
              if (check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<_typeobject*,std::allocator<_typeobject*>>::
                _M_realloc_insert<_typeobject*>
                          ((vector<_typeobject*,std::allocator<_typeobject*>> *)&pvStack_58,
                           (iterator)
                           check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,&local_60);
              }
              else {
                *check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                 super__Vector_impl_data._M_start = local_60;
                check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                super__Vector_impl_data._M_start =
                     check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl
                     .super__Vector_impl_data._M_start + 1;
              }
            }
            object::~object((object *)&local_38);
          }
        }
        else {
          p_Var4 = p_Var10[3]._M_nxt;
          for (p_Var16 = p_Var10[2]._M_nxt; p_Var16 != p_Var4; p_Var16 = p_Var16 + 1) {
            local_38.m_ptr = (PyObject *)p_Var16->_M_nxt;
            pptVar5 = (bases->
                      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            __position._M_current =
                 (bases->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (pptVar5 == __position._M_current) {
LAB_0010aaa1:
              if (__position._M_current ==
                  (bases->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
                _M_realloc_insert<pybind11::detail::type_info*const&>
                          ((vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
                            *)bases,__position,(type_info **)&local_38);
              }
              else {
                *__position._M_current = (type_info *)local_38.m_ptr;
                ppptVar1 = &(bases->
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *ppptVar1 = *ppptVar1 + 1;
              }
            }
            else {
              do {
                pptVar11 = pptVar5 + 1;
                bVar12 = false;
                if (*pptVar5 == (type_info *)local_38.m_ptr) {
                  bVar12 = true;
                  break;
                }
                pptVar5 = pptVar11;
              } while (pptVar11 != __position._M_current);
              if (!bVar12) goto LAB_0010aaa1;
            }
          }
        }
      }
      uVar18 = uVar18 + 1;
      uVar14 = (long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl
                     .super__Vector_impl_data._M_start - (long)pvStack_58 >> 3;
    } while (uVar18 < uVar14);
  }
  if (pvStack_58 != (void *)0x0) {
    operator_delete(pvStack_58,
                    (long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}